

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassNormFactor(void *arkode_mem,realtype nrmfac)

{
  sunindextype sVar1;
  double in_XMM0_Qa;
  realtype rVar2;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  ARKodeMem *in_stack_ffffffffffffffc8;
  double dVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffd8,
                                (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ),in_stack_ffffffffffffffc8,
                                (ARKLsMassMem *)in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    if (in_XMM0_Qa <= 0.0) {
      if (0.0 <= in_XMM0_Qa) {
        sVar1 = N_VGetLength((N_Vector)0x115215d);
        if (0.0 < (double)sVar1) {
          sVar1 = N_VGetLength((N_Vector)0x1152186);
          dVar3 = sqrt((double)sVar1);
        }
        else {
          dVar3 = 0.0;
        }
        *(double *)((long)in_stack_ffffffffffffffd8 + 0x30) = dVar3;
      }
      else {
        N_VConst((realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        rVar2 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (0.0 < rVar2) {
          rVar2 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          dVar3 = sqrt(rVar2);
        }
        else {
          dVar3 = 0.0;
        }
        *(double *)((long)in_stack_ffffffffffffffd8 + 0x30) = dVar3;
      }
    }
    else {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0x30) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetMassNormFactor(void *arkode_mem, realtype nrmfac)
{
  ARKodeMem     ark_mem;
  ARKLsMassMem  arkls_mem;
  int           retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassNormFactor",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);

  if (nrmfac > ZERO) {
    /* set user-provided factor */
    arkls_mem->nrmfac = nrmfac;
  } else if (nrmfac < ZERO) {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, ark_mem->tempv1);
    arkls_mem->nrmfac = SUNRsqrt(N_VDotProd(ark_mem->tempv1, ark_mem->tempv1));
  } else {
    /* compute default factor for WRMS norm from vector legnth */
    arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(ark_mem->tempv1));
  }

  return(ARKLS_SUCCESS);
}